

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsVarSerializerReleaseData(JsVarSerializerHandle serializerHandle,byte **data,size_t *dataLength)

{
  bool bVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext;
  ChakraCoreStreamWriter *streamWriter;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar2 = JsErrorNullArgument;
  if (dataLength != (size_t *)0x0 &&
      (data != (byte **)0x0 && serializerHandle != (JsVarSerializerHandle)0x0)) {
    currentContext = JsrtContext::GetCurrent();
    JVar2 = CheckContext(currentContext,false,false);
    if (JVar2 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      bVar1 = ChakraCoreStreamWriter::ReleaseData
                        ((ChakraCoreStreamWriter *)serializerHandle,data,dataLength);
      JVar2 = JsErrorInvalidArgument;
      if (bVar1) {
        JVar2 = JsNoError;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsVarSerializerReleaseData(
    _In_ JsVarSerializerHandle serializerHandle,
    _Out_ byte** data,
    _Out_ size_t *dataLength)
{
    PARAM_NOT_NULL(serializerHandle);
    PARAM_NOT_NULL(data);
    PARAM_NOT_NULL(dataLength);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        if (!streamWriter->ReleaseData(data, dataLength))
        {
            return JsErrorInvalidArgument;
        }
        return JsNoError;
    });
}